

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void * jx9_context_alloc_chunk(jx9_context *pCtx,uint nByte,int ZeroChunk,int AutoRelease)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  jx9_aux_data sAux;
  undefined1 *local_30;
  
  puVar1 = (undefined1 *)SyMemBackendAlloc(&pCtx->pVm->sAllocator,nByte);
  if (puVar1 != (undefined1 *)0x0) {
    if ((ZeroChunk != 0) && (nByte != 0)) {
      puVar2 = puVar1 + nByte;
      puVar3 = puVar1;
      do {
        *puVar3 = 0;
        if (puVar2 <= puVar3 + 1) break;
        puVar3[1] = 0;
        if (puVar2 <= puVar3 + 2) break;
        puVar3[2] = 0;
        if (puVar2 <= puVar3 + 3) break;
        puVar3[3] = 0;
        puVar3 = puVar3 + 4;
      } while (puVar3 < puVar2);
    }
    if (AutoRelease != 0) {
      local_30 = puVar1;
      SySetPut(&pCtx->sChunk,&local_30);
    }
  }
  return puVar1;
}

Assistant:

JX9_PRIVATE void * jx9_context_alloc_chunk(jx9_context *pCtx, unsigned int nByte, int ZeroChunk, int AutoRelease)
{
	void *pChunk;
	pChunk = SyMemBackendAlloc(&pCtx->pVm->sAllocator, nByte);
	if( pChunk ){
		if( ZeroChunk ){
			/* Zero the memory chunk */
			SyZero(pChunk, nByte);
		}
		if( AutoRelease ){
			jx9_aux_data sAux;
			/* Track the chunk so that it can be released automatically 
			 * upon this context is destroyed.
			 */
			sAux.pAuxData = pChunk;
			SySetPut(&pCtx->sChunk, (const void *)&sAux);
		}
	}
	return pChunk;
}